

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O3

int xmlShellSave(xmlShellCtxtPtr ctxt,char *filename,xmlNodePtr node,xmlNodePtr node2)

{
  xmlDocPtr cur;
  xmlGenericErrorFunc p_Var1;
  int iVar2;
  xmlGenericErrorFunc *pp_Var3;
  void **ppvVar4;
  
  iVar2 = -1;
  if (((ctxt != (xmlShellCtxtPtr)0x0) && (cur = ctxt->doc, cur != (xmlDocPtr)0x0)) &&
     (((filename != (char *)0x0 && (*filename != '\0')) ||
      (filename = ctxt->filename, filename != (char *)0x0)))) {
    if (cur->type == XML_HTML_DOCUMENT_NODE) {
      iVar2 = htmlSaveFile(filename,cur);
    }
    else {
      if (cur->type != XML_DOCUMENT_NODE) {
        pp_Var3 = __xmlGenericError();
        p_Var1 = *pp_Var3;
        ppvVar4 = __xmlGenericErrorContext();
        (*p_Var1)(*ppvVar4,"To save to subparts of a document use the \'write\' command\n");
        return -1;
      }
      iVar2 = xmlSaveFile(filename,cur);
    }
    if (iVar2 < 0) {
      pp_Var3 = __xmlGenericError();
      p_Var1 = *pp_Var3;
      ppvVar4 = __xmlGenericErrorContext();
      iVar2 = 0;
      (*p_Var1)(*ppvVar4,"Failed to save to %s\n",filename);
    }
    else {
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int
xmlShellSave(xmlShellCtxtPtr ctxt, char *filename,
             xmlNodePtr node ATTRIBUTE_UNUSED,
             xmlNodePtr node2 ATTRIBUTE_UNUSED)
{
    if ((ctxt == NULL) || (ctxt->doc == NULL))
        return (-1);
    if ((filename == NULL) || (filename[0] == 0))
        filename = ctxt->filename;
    if (filename == NULL)
        return (-1);
#ifdef W_OK
    if (access((char *) filename, W_OK)) {
        xmlGenericError(xmlGenericErrorContext,
                        "Cannot save to %s\n", filename);
        return (-1);
    }
#endif
    switch (ctxt->doc->type) {
        case XML_DOCUMENT_NODE:
            if (xmlSaveFile((char *) filename, ctxt->doc) < 0) {
                xmlGenericError(xmlGenericErrorContext,
                                "Failed to save to %s\n", filename);
            }
            break;
        case XML_HTML_DOCUMENT_NODE:
#ifdef LIBXML_HTML_ENABLED
            if (htmlSaveFile((char *) filename, ctxt->doc) < 0) {
                xmlGenericError(xmlGenericErrorContext,
                                "Failed to save to %s\n", filename);
            }
#else
            if (xmlSaveFile((char *) filename, ctxt->doc) < 0) {
                xmlGenericError(xmlGenericErrorContext,
                                "Failed to save to %s\n", filename);
            }
#endif /* LIBXML_HTML_ENABLED */
            break;
        default:
            xmlGenericError(xmlGenericErrorContext,
	    "To save to subparts of a document use the 'write' command\n");
            return (-1);

    }
    return (0);
}